

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O1

void __thiscall CVmObjGramProd::save_to_stream(CVmObjGramProd *this,CVmStream *fp)

{
  char *pcVar1;
  uint *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  ushort *puVar6;
  ulong uVar7;
  
  (*fp->_vptr_CVmStream[0xb])(fp,(ulong)*(uint *)((this->super_CVmObject).ext_ + 0x38));
  pcVar1 = (this->super_CVmObject).ext_;
  if (*(long *)(pcVar1 + 0x38) != 0) {
    puVar3 = *(undefined8 **)(pcVar1 + 0x30);
    uVar4 = 0;
    do {
      puVar2 = (uint *)*puVar3;
      (*fp->_vptr_CVmStream[10])(fp,(ulong)*puVar2);
      (*fp->_vptr_CVmStream[10])(fp,(ulong)puVar2[1]);
      (*fp->_vptr_CVmStream[0xd])(fp,(ulong)puVar2[3]);
      (*fp->_vptr_CVmStream[0xb])(fp,(ulong)puVar2[6]);
      if (*(long *)(puVar2 + 6) != 0) {
        puVar6 = *(ushort **)(puVar2 + 4);
        uVar7 = 0;
        do {
          (*fp->_vptr_CVmStream[0xb])(fp,(ulong)*puVar6);
          (*fp->_vptr_CVmStream[4])(fp,(ulong)(byte)puVar6[1]);
          switch((char)puVar6[1]) {
          case '\x01':
          case '\x04':
            (*fp->_vptr_CVmStream[0xd])(fp,(ulong)*(uint *)(puVar6 + 4));
            break;
          case '\x02':
            (*fp->_vptr_CVmStream[0xb])(fp,(ulong)puVar6[4]);
            break;
          case '\x03':
            (*fp->_vptr_CVmStream[0xb])(fp,(ulong)*(uint *)(puVar6 + 8));
            (*fp->_vptr_CVmStream[0x11])(fp,*(undefined8 *)(puVar6 + 4),*(undefined8 *)(puVar6 + 8))
            ;
            break;
          case '\x06':
            (*fp->_vptr_CVmStream[0xb])(fp,(ulong)*(uint *)(puVar6 + 4));
            if (*(long *)(puVar6 + 4) != 0) {
              uVar5 = 0;
              do {
                (*fp->_vptr_CVmStream[0xb])
                          (fp,(ulong)*(ushort *)(*(long *)(puVar6 + 8) + uVar5 * 2));
                uVar5 = uVar5 + 1;
              } while (uVar5 < *(ulong *)(puVar6 + 4));
            }
          }
          uVar7 = uVar7 + 1;
          puVar6 = puVar6 + 0x10;
        } while (uVar7 < *(ulong *)(puVar2 + 6));
      }
      uVar4 = uVar4 + 1;
      puVar3 = puVar3 + 1;
    } while (uVar4 < *(ulong *)((this->super_CVmObject).ext_ + 0x38));
  }
  return;
}

Assistant:

void CVmObjGramProd::save_to_stream(VMG_ CVmStream *fp)
{
    /* write the number of alternatives */
    fp->write_uint2(get_ext()->alt_cnt_);

    /* write the alternatives */
    vmgram_alt_info **altp = get_ext()->alts_;
    for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i, ++altp)
    {
        /* get the alternative pointer */
        vmgram_alt_info *alt = *altp;
        
        /* write the alternative header */
        fp->write_int2(alt->score);
        fp->write_int2(alt->badness);
        fp->write_uint4((ulong)alt->proc_obj);
        fp->write_uint2(alt->tok_cnt);
        
        /* write the token list */
        vmgram_tok_info *tok = alt->toks;
        for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
        {
            /* write the fixed part of the token */
            fp->write_uint2((uint)tok->prop);
            fp->write_byte((uchar)tok->typ);
            
            /* write the extra data according to the token type */
            switch (tok->typ)
            {
            case VMGRAM_MATCH_PROD:
                /* write the object ID */
                fp->write_uint4((ulong)tok->typinfo.prod_obj);
                break;
                
            case VMGRAM_MATCH_SPEECH:
                /* write the part-of-speech property */
                fp->write_uint2((uint)tok->typinfo.speech_prop);
                break;
                
            case VMGRAM_MATCH_NSPEECH:
                /* array of part-of-speech properties - write the count */
                fp->write_uint2(tok->typinfo.nspeech.cnt);
                
                /* write the array elements */
                for (size_t k = 0 ; k < tok->typinfo.nspeech.cnt ; ++k)
                    fp->write_uint2((uint)tok->typinfo.nspeech.props[k]);
                
                /* done */
                break;
                
            case VMGRAM_MATCH_LITERAL:
                /* literal string - write the length, then the bytes */
                fp->write_uint2(tok->typinfo.lit.len);
                fp->write_bytes(tok->typinfo.lit.str, tok->typinfo.lit.len);
                break;
                
            case VMGRAM_MATCH_TOKTYPE:
                /* token type */
                fp->write_uint4((ulong)tok->typinfo.toktyp_enum);
                break;
                
            case VMGRAM_MATCH_STAR:
                /* star - no additional data */
                break;
            }
        }
    }
}